

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O1

mat4 * dja::mat4::homogeneous::from_mat3(mat3 *m)

{
  float_t fVar1;
  float_t fVar2;
  float_t fVar3;
  float_t fVar4;
  float_t fVar5;
  float_t fVar6;
  float_t fVar7;
  float_t fVar8;
  float_t fVar9;
  mat4 *in_RDI;
  
  fVar4 = m->m[0].x;
  fVar5 = m->m[0].y;
  fVar1 = m->m[0].z;
  fVar6 = m->m[1].x;
  fVar7 = m->m[1].y;
  fVar2 = m->m[1].z;
  fVar8 = m->m[2].x;
  fVar9 = m->m[2].y;
  fVar3 = m->m[2].z;
  in_RDI->m[0].x = 0.0;
  in_RDI->m[0].y = 0.0;
  in_RDI->m[0].z = 0.0;
  in_RDI->m[0].w = 0.0;
  in_RDI->m[1].x = 0.0;
  in_RDI->m[1].y = 0.0;
  in_RDI->m[1].z = 0.0;
  in_RDI->m[1].w = 0.0;
  in_RDI->m[2].x = 0.0;
  in_RDI->m[2].y = 0.0;
  in_RDI->m[2].z = 0.0;
  in_RDI->m[2].w = 0.0;
  in_RDI->m[3].x = 0.0;
  in_RDI->m[3].y = 0.0;
  in_RDI->m[3].z = 0.0;
  in_RDI->m[3].w = 0.0;
  in_RDI->m[0].x = fVar4;
  in_RDI->m[0].y = fVar5;
  in_RDI->m[0].z = fVar1;
  in_RDI->m[0].w = 0.0;
  in_RDI->m[1].x = fVar6;
  in_RDI->m[1].y = fVar7;
  in_RDI->m[1].z = fVar2;
  in_RDI->m[1].w = 0.0;
  in_RDI->m[2].x = fVar8;
  in_RDI->m[2].y = fVar9;
  in_RDI->m[2].z = fVar3;
  *(undefined8 *)&in_RDI->m[2].w = 0;
  in_RDI->m[3].y = 0.0;
  in_RDI->m[3].z = 0.0;
  in_RDI->m[3].w = 1.0;
  return in_RDI;
}

Assistant:

mat4 mat4::homogeneous::from_mat3(const mat3& m)
{
    return mat4(M00(m), M01(m), M02(m), 0,
                M10(m), M11(m), M12(m), 0,
                M20(m), M21(m), M22(m), 0,
                0     , 0     , 0     , 1);
}